

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

double __thiscall
ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled(ChebyshevExpansion *this,double xscaled)

{
  Index IVar1;
  CoeffReturnType pdVar2;
  double dVar3;
  undefined4 local_3c;
  double dStack_38;
  int k;
  double u_kp2;
  double u_kp1;
  double u_k;
  size_t Norder;
  double xscaled_local;
  ChebyshevExpansion *this_local;
  
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,IVar1 + -1)
  ;
  dStack_38 = 0.0;
  local_3c = (int)(IVar1 + -1);
  u_kp2 = *pdVar2;
  while (local_3c = local_3c + -1, 0 < local_3c) {
    dVar3 = -dStack_38;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,
                        (long)local_3c);
    dStack_38 = u_kp2;
    u_kp2 = xscaled * 2.0 * u_kp2 + dVar3 + *pdVar2;
  }
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,0);
  return (xscaled * u_kp2 + *pdVar2) - dStack_38;
}

Assistant:

double ChebyshevExpansion::y_Clenshaw_xscaled(const double xscaled) const {
        // See https://en.wikipedia.org/wiki/Clenshaw_algorithm#Special_case_for_Chebyshev_series
        std::size_t Norder = m_c.size() - 1;
        double u_k = 0, u_kp1 = m_c[Norder], u_kp2 = 0;
        int k = 0;
        for (k = static_cast<int>(Norder) - 1; k >= 1; --k) {
            // Do the recurrent calculation
            u_k = 2.0 * xscaled * u_kp1 - u_kp2 + m_c(k);
            // Update the values
            u_kp2 = u_kp1; u_kp1 = u_k;
        }
        return m_c(0) + xscaled * u_kp1 - u_kp2;
    }